

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsSecondaryTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,ComputeInvocationsSecondaryTestInstance *this,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes,VkQueryPool queryPool)

{
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  *pvVar1;
  Allocation *pAVar2;
  undefined8 uVar3;
  deUint32 dVar4;
  VkResult result_00;
  DeviceInterface *vkd;
  ParametersCompute *parm;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  deUint64 dVar9;
  uint uVar10;
  ParametersCompute *parm_00;
  pointer pPVar11;
  TestStatus *__return_storage_ptr___00;
  bool bVar12;
  allocator<char> local_91;
  undefined1 local_90 [32];
  TestStatus *local_70;
  SharedPtr<vkt::Draw::Buffer> *local_68;
  VkDeviceSize local_60;
  deUint64 local_58;
  deUint64 result;
  
  parm_00 = (ParametersCompute *)this;
  local_70 = __return_storage_ptr__;
  local_68 = buffer;
  local_60 = bufferSizeBytes;
  local_58 = queryPool.m_internal;
  vkd = Context::getDeviceInterface
                  ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                   super_TestInstance.m_context);
  parm = (ParametersCompute *)
         Context::getDevice((this->super_ComputeInvocationsTestInstance).
                            super_StatisticQueryTestInstance.super_TestInstance.m_context);
  result = 0;
  pvVar1 = (this->super_ComputeInvocationsTestInstance).m_parameters;
  pPVar11 = (pvVar1->
            super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = ((long)(pvVar1->
                 super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar11) / 0x38;
  dVar9 = 0;
  while (bVar12 = lVar5 != 0, lVar5 = lVar5 + -1, bVar12) {
    dVar4 = ComputeInvocationsTestInstance::getComputeExecution
                      ((ComputeInvocationsTestInstance *)pPVar11,parm_00);
    dVar9 = dVar9 + dVar4;
    pPVar11 = pPVar11 + 1;
  }
  result_00 = (*vkd->_vptr_DeviceInterface[0x20])(vkd,parm,local_58,0,1,8,&result,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x21e);
  if (dVar9 == result) {
    pAVar2 = (local_68->m_ptr->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    local_90._0_8_ = &PTR__Allocation_00c234b8;
    local_90._8_8_ = (pAVar2->m_memory).m_internal;
    local_90._16_8_ = pAVar2->m_offset;
    local_90._24_8_ = pAVar2->m_hostPtr;
    ::vk::invalidateMappedMemoryRange
              (vkd,(VkDevice)parm,(VkDeviceMemory)local_90._8_8_,local_90._16_8_,local_60);
    uVar3 = local_90._24_8_;
    pvVar1 = (this->super_ComputeInvocationsTestInstance).m_parameters;
    pPVar11 = (pvVar1->
              super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = ((long)(pvVar1->
                   super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar11) / 0x38;
    uVar10 = 0xffffffff;
    lVar5 = lVar6;
    while( true ) {
      __return_storage_ptr___00 = local_70;
      bVar12 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar12) break;
      dVar4 = ComputeInvocationsTestInstance::getComputeExecution
                        ((ComputeInvocationsTestInstance *)pPVar11,parm);
      if (dVar4 <= uVar10) {
        uVar10 = dVar4;
      }
      pPVar11 = pPVar11 + 1;
    }
    uVar7 = -lVar6;
    uVar8 = 0;
    do {
      if (uVar10 == uVar8) {
        ::vk::Allocation::~Allocation((Allocation *)local_90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_90,"Pass",(allocator<char> *)&result);
        tcu::TestStatus::pass(__return_storage_ptr___00,(string *)local_90);
        goto LAB_00695809;
      }
      lVar5 = uVar8 * 4;
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 + lVar6;
    } while (uVar7 == *(uint *)(uVar3 + lVar5));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"Compute shader didn\'t write data to the buffer",&local_91);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
    ::vk::Allocation::~Allocation((Allocation *)local_90);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"QueryPoolResults incorrect",&local_91);
    __return_storage_ptr___00 = local_70;
    tcu::TestStatus::fail(local_70,(string *)local_90);
LAB_00695809:
    std::__cxx11::string::~string((string *)local_90);
  }
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus ComputeInvocationsSecondaryTestInstance::checkResult (const de::SharedPtr<Buffer> buffer, const VkDeviceSize bufferSizeBytes, const VkQueryPool queryPool)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	{
		deUint64 result		= 0u;
		deUint64 expected	= 0u;
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
			expected += getComputeExecution(m_parameters[parametersNdx]);
		VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
		if (expected != result)
			return tcu::TestStatus::fail("QueryPoolResults incorrect");
	}

	{
		// Validate the results
		const Allocation&	bufferAllocation	= buffer->getBoundMemory();
		invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);
		const deUint32*		bufferPtr			= static_cast<deUint32*>(bufferAllocation.getHostPtr());
		deUint32			minSize				= ~0u;
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
			minSize = deMinu32(minSize, getComputeExecution(m_parameters[parametersNdx]));
		for (deUint32 ndx = 0u; ndx < minSize; ++ndx)
		{
			if (bufferPtr[ndx] != ndx * m_parameters.size())
				return tcu::TestStatus::fail("Compute shader didn't write data to the buffer");
		}
	}
	return tcu::TestStatus::pass("Pass");
}